

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void background_thread_init(tsd_t *tsd,background_thread_info_t *info)

{
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[7] = '\x01';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[8] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[9] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[10] = '\0';
  background_thread_info_init((tsdn_t *)tsd,info);
  duckdb_je_n_background_threads = duckdb_je_n_background_threads + 1;
  return;
}

Assistant:

static void
background_thread_init(tsd_t *tsd, background_thread_info_t *info) {
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);
	info->state = background_thread_started;
	background_thread_info_init(tsd_tsdn(tsd), info);
	n_background_threads++;
}